

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  long lVar3;
  mapped_type_conflict *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  TPZGeoElSide neigh;
  long local_68;
  undefined **local_60;
  TPZGeoEl *local_58;
  int local_50;
  TPZGeoElSide local_48;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018a7fd8;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018a74c0,DestMesh,&cp->super_TPZGeoEl,gl2lcElMap
                    );
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018a71c0;
  pzgeom::TPZNodeRep<4,_pztopology::TPZQuadrilateral>::TPZNodeRep
            ((TPZNodeRep<4,_pztopology::TPZQuadrilateral> *)&this->fGeo,&PTR_PTR_018a7090,
             (TPZNodeRep<4,_pztopology::TPZQuadrilateral> *)&cp->fGeo,gl2lcNdMap);
  (this->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
  super_TPZQuadrilateral.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZQuadSphere_018a7030;
  (this->fGeo).fR = 0.0;
  local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZVec<double>::TPZVec(&(this->fGeo).fxc,3,(double *)&local_48);
  lVar3 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar3) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar3) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar3) = 0xffffffffffffffff;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0xd8);
  p_Var1 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
  lVar3 = 0;
LAB_00f54bce:
  TPZGeoElSide::TPZGeoElSide(&local_48,cp->fNeighbours + lVar3,(cp->super_TPZGeoEl).fMesh);
  do {
    iVar2 = local_48.fSide;
    local_68 = (local_48.fGeoEl)->fIndex;
    p_Var6 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    if (p_Var6 == (_Base_ptr)0x0) {
LAB_00f54c49:
      (**(code **)(*(long *)local_48.fGeoEl + 0x188))(&local_60,local_48.fGeoEl,local_48.fSide);
    }
    else {
      do {
        if (local_68 <= (long)*(size_t *)(p_Var6 + 1)) {
          p_Var5 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(long)*(size_t *)(p_Var6 + 1) < local_68];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         ((long)((_Rb_tree_header *)p_Var5)->_M_node_count <= local_68)) break;
      if (local_48.fGeoEl != (TPZGeoEl *)0x0) goto LAB_00f54c49;
      local_60 = &PTR__TPZGeoElSide_018f8760;
      local_58 = (TPZGeoEl *)0x0;
      local_50 = -1;
    }
    local_48.fSide = local_50;
    local_48.fGeoEl = local_58;
  } while( true );
  pmVar4 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           operator[](gl2lcElMap,&local_68);
  this->fNeighbours[lVar3].fGeoElIndex = *pmVar4;
  this->fNeighbours[lVar3].fSide = iVar2;
  lVar3 = lVar3 + 1;
  if (lVar3 == 9) {
    return;
  }
  goto LAB_00f54bce;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}